

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O2

int Abc_ExactDelayCost(word *pTruth,int nVars,int *pArrTimeProfile,char *pPerm,int *Cost,
                      int AigLevel)

{
  char cVar1;
  uint uVar2;
  undefined8 uVar3;
  ulong uVar4;
  unsigned_long *puVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  Ses_Store_t *pSVar11;
  int iVar12;
  abctime aVar13;
  abctime aVar14;
  ulong uVar15;
  Ses_Man_t *pSes;
  char *pcVar16;
  int Delay2;
  word *pwVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  char *local_98;
  char *local_80;
  abctime local_78;
  word *local_70;
  uint local_64;
  abctime local_60;
  int pNormalArrTime [8];
  int nMaxArrival;
  
  uVar4 = (ulong)(uint)nVars;
  local_80 = (char *)0x0;
  local_70 = pTruth;
  aVar13 = Abc_Clock();
  pSVar11 = s_pSesStore;
  if (8 < (uint)nVars) {
    printf("invalid truth table size %d\n",uVar4);
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExact.c"
                  ,0xaa9,"int Abc_ExactDelayCost(word *, int, int *, char *, int *, int)");
  }
  s_pSesStore->nCutCount = s_pSesStore->nCutCount + 1;
  pSVar11->pCutCount[uVar4] = pSVar11->pCutCount[uVar4] + 1;
  if (nVars == 0) {
    auVar19._8_4_ = 0xffffffff;
    auVar19._0_8_ = 0xffffffffffffffff;
    auVar19._12_4_ = 0xffffffff;
    pSVar11->nSynthesizedTrivial = pSVar11->nSynthesizedTrivial + 1;
    pSVar11->pSynthesizedTrivial[0] = pSVar11->pSynthesizedTrivial[0] - auVar19._8_8_;
    *Cost = 0;
    aVar14 = Abc_Clock();
    s_pSesStore->timeTotal = s_pSesStore->timeTotal + (aVar14 - aVar13);
    iVar12 = 0;
  }
  else if (nVars == 1) {
    pSVar11->nSynthesizedTrivial = pSVar11->nSynthesizedTrivial + 1;
    pSVar11->pSynthesizedTrivial[1] = pSVar11->pSynthesizedTrivial[1] + 1;
    *Cost = 0;
    *pPerm = '\0';
    aVar14 = Abc_Clock();
    s_pSesStore->timeTotal = s_pSesStore->timeTotal + (aVar14 - aVar13);
    iVar12 = *pArrTimeProfile;
  }
  else {
    for (uVar15 = 0; uVar4 != uVar15; uVar15 = uVar15 + 1) {
      pNormalArrTime[uVar15] = pArrTimeProfile[uVar15];
    }
    local_60 = aVar13;
    iVar12 = Abc_NormalizeArrivalTimes(pNormalArrTime,nVars,&nMaxArrival);
    pwVar17 = local_70;
    local_78 = CONCAT44(local_78._4_4_,iVar12);
    *Cost = 1000000000;
    iVar12 = Ses_StoreGetEntry(pSVar11,local_70,nVars,pNormalArrTime,&local_80);
    pSVar11 = s_pSesStore;
    if (iVar12 == 0) {
      if (s_pSesStore->fVeryVerbose != 0) {
        printf("\x1b[36m");
        Abc_TtPrintHexRev((FILE *)_stdout,pwVar17,nVars);
        printf("\x1b[0m");
        printf(" [%d",(ulong)(uint)pNormalArrTime[0]);
        for (uVar15 = 1; uVar15 < uVar4; uVar15 = uVar15 + 1) {
          printf(" %d",(ulong)(uint)pNormalArrTime[uVar15]);
        }
        printf("]@%d:",AigLevel);
        fflush(_stdout);
      }
      for (uVar15 = 1; uVar15 < uVar4; uVar15 = uVar15 + 1) {
        if (pNormalArrTime[0] <= pNormalArrTime[uVar15]) {
          pNormalArrTime[0] = pNormalArrTime[uVar15];
        }
      }
      iVar12 = nVars + pNormalArrTime[0] + 1;
      if (AigLevel != -1) {
        iVar12 = nVars + 1 + iVar12;
        if (AigLevel - (int)local_78 < iVar12) {
          iVar12 = AigLevel - (int)local_78;
        }
      }
      local_78 = Abc_Clock();
      pwVar17 = local_70;
      pSes = Ses_ManAlloc(local_70,nVars,1,iVar12,pNormalArrTime,s_pSesStore->fMakeAIG,
                          s_pSesStore->nBTLimit,s_pSesStore->fVerbose);
      pSVar11 = s_pSesStore;
      pSes->fVeryVerbose = s_pSesStore->fVeryVerbose;
      pSes->pSat = pSVar11->pSat;
      pSes->nStartGates = nVars + -2;
      local_98 = local_80;
      iVar12 = pSes->nMaxDepth;
      while (iVar12 != 0) {
        if (s_pSesStore->fVeryVerbose != 0) {
          printf(" %d");
          fflush(_stdout);
        }
        pcVar16 = Ses_ManFindMinimumSize(pSes);
        if (pcVar16 == (char *)0x0) {
          local_80 = local_98;
          if (s_pSesStore->fVeryVerbose != 0) {
            uVar2 = pSes->nMaxDepth;
            if (9 < (int)uVar2) {
              putchar(8);
              uVar2 = pSes->nMaxDepth;
            }
            pcVar16 = "\x1b[31m";
            if (pSes->fHitResLimit == 0) {
              pcVar16 = "\x1b[33m";
            }
            printf("\b%s%d\x1b[0m",pcVar16,(ulong)uVar2);
          }
          goto LAB_0028347d;
        }
        if (s_pSesStore->fVeryVerbose != 0) {
          uVar2 = pSes->nMaxDepth;
          if (9 < (int)uVar2) {
            putchar(8);
            uVar2 = pSes->nMaxDepth;
          }
          printf("\b\x1b[32m%d\x1b[0m",(ulong)uVar2);
        }
        free(local_98);
        iVar12 = pSes->nMaxDepth + -1;
        pSes->nMaxDepth = iVar12;
        local_98 = pcVar16;
      }
      local_80 = local_98;
LAB_0028347d:
      if (s_pSesStore->fVeryVerbose != 0) {
        puts("        ");
      }
      pSVar11 = s_pSesStore;
      if (((FILE *)s_pSesStore->pDebugEntries != (FILE *)0x0) && (pSes->fHitResLimit != 0)) {
        local_64 = pSes->nMaxDepth;
        fprintf((FILE *)s_pSesStore->pDebugEntries,"abc -c \"exact -v -C %d",
                (ulong)(uint)s_pSesStore->nBTLimit);
        if (s_pSesStore->fMakeAIG != 0) {
          fwrite(" -a",3,1,(FILE *)pSVar11->pDebugEntries);
        }
        fprintf((FILE *)pSVar11->pDebugEntries," -S %d -D %d -A",(ulong)(nVars - 1),(ulong)local_64)
        ;
        for (uVar15 = 0; uVar4 != uVar15; uVar15 = uVar15 + 1) {
          uVar3 = 0x2c;
          if (uVar15 == 0) {
            uVar3 = 0x20;
          }
          fprintf((FILE *)pSVar11->pDebugEntries,"%c%d",uVar3,(ulong)(uint)pNormalArrTime[uVar15]);
        }
        fputc(0x20,(FILE *)pSVar11->pDebugEntries);
        pwVar17 = local_70;
        Abc_TtPrintHexRev(pSVar11->pDebugEntries,local_70,nVars);
        fwrite("\" # ",4,1,(FILE *)pSVar11->pDebugEntries);
        if (local_98 == (char *)0x0) {
          fwrite("no ",3,1,(FILE *)pSVar11->pDebugEntries);
        }
        fwrite("solution found before\n",0x16,1,(FILE *)pSVar11->pDebugEntries);
      }
      aVar13 = Abc_Clock();
      pSes->timeTotal = aVar13 - local_78;
      pSVar11 = s_pSesStore;
      lVar10._0_4_ = pSes->nSatCalls;
      lVar10._4_4_ = pSes->nUnsatCalls;
      auVar18._8_4_ = lVar10._4_4_;
      auVar18._0_8_ = lVar10;
      auVar18._12_4_ = -(uint)(lVar10 < 0);
      puVar5 = &s_pSesStore->nUnsatCalls;
      lVar6 = s_pSesStore->timeSat;
      lVar7 = s_pSesStore->timeSatSat;
      lVar8 = s_pSesStore->timeSatUnsat;
      lVar9 = s_pSesStore->timeSatUndef;
      s_pSesStore->nSatCalls =
           s_pSesStore->nSatCalls +
           CONCAT44(-(uint)((int)(undefined4)lVar10 < 0),(undefined4)lVar10);
      pSVar11->nUnsatCalls = *puVar5 + auVar18._8_8_;
      pSVar11->nUndefCalls = pSVar11->nUndefCalls + (long)pSes->nUndefCalls;
      lVar10 = pSes->timeSatSat;
      pSVar11->timeSat = pSes->timeSat + lVar6;
      pSVar11->timeSatSat = lVar10 + lVar7;
      lVar10 = pSes->timeSatUndef;
      pSVar11->timeSatUnsat = pSes->timeSatUnsat + lVar8;
      pSVar11->timeSatUndef = lVar10 + lVar9;
      pSVar11->timeInstance = pSVar11->timeInstance + pSes->timeInstance;
      pSVar11->timeExact = pSVar11->timeExact + (aVar13 - local_78);
      iVar12 = pSes->fHitResLimit;
      Ses_ManCleanLight(pSes);
      Ses_StoreAddEntry(s_pSesStore,pwVar17,nVars,pNormalArrTime,local_98,iVar12);
    }
    else {
      s_pSesStore->nCacheHits = s_pSesStore->nCacheHits + 1;
      pSVar11->pCacheHits[uVar4] = pSVar11->pCacheHits[uVar4] + 1;
      local_98 = local_80;
    }
    aVar13 = local_60;
    if (local_98 == (char *)0x0) {
      if (*Cost != 1000000000) {
        __assert_fail("*Cost == ABC_INFINITY",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExact.c"
                      ,0xb46,"int Abc_ExactDelayCost(word *, int, int *, char *, int *, int)");
      }
      aVar14 = Abc_Clock();
      s_pSesStore->timeTotal = s_pSesStore->timeTotal + (aVar14 - aVar13);
      iVar12 = 1000000000;
    }
    else {
      *Cost = (int)local_98[2];
      cVar1 = local_98[2];
      for (uVar15 = 0; uVar4 != uVar15; uVar15 = uVar15 + 1) {
        pPerm[uVar15] = local_98[uVar15 + (long)((int)cVar1 << 2) + 5];
      }
      iVar12 = 0;
      for (uVar15 = 0; uVar4 != uVar15; uVar15 = uVar15 + 1) {
        if (iVar12 <= (int)pPerm[uVar15] + pArrTimeProfile[uVar15]) {
          iVar12 = (int)pPerm[uVar15] + pArrTimeProfile[uVar15];
        }
      }
      aVar14 = Abc_Clock();
      s_pSesStore->timeTotal = s_pSesStore->timeTotal + (aVar14 - aVar13);
    }
  }
  return iVar12;
}

Assistant:

int Abc_ExactDelayCost( word * pTruth, int nVars, int * pArrTimeProfile, char * pPerm, int * Cost, int AigLevel )
{
    int i, nMaxArrival, nDelta, l;
    Ses_Man_t * pSes = NULL;
    char * pSol = NULL, * pSol2 = NULL, * p;
    int pNormalArrTime[8];
    int Delay = ABC_INFINITY, nMaxDepth, fResLimit;
    abctime timeStart = Abc_Clock(), timeStartExact;

    /* some checks */
    if ( nVars < 0 || nVars > 8 )
    {
        printf( "invalid truth table size %d\n", nVars );
        assert( 0 );
    }

    /* statistics */
    s_pSesStore->nCutCount++;
    s_pSesStore->pCutCount[nVars]++;

    if ( nVars == 0 )
    {
        s_pSesStore->nSynthesizedTrivial++;
        s_pSesStore->pSynthesizedTrivial[0]++;

        *Cost = 0;
        s_pSesStore->timeTotal += ( Abc_Clock() - timeStart );
        return 0;
    }

    if ( nVars == 1 )
    {
        s_pSesStore->nSynthesizedTrivial++;
        s_pSesStore->pSynthesizedTrivial[1]++;

        *Cost = 0;
        pPerm[0] = (char)0;
        s_pSesStore->timeTotal += ( Abc_Clock() - timeStart );
        return pArrTimeProfile[0];
    }

    for ( l = 0; l < nVars; ++l )
        pNormalArrTime[l] = pArrTimeProfile[l];

    nDelta = Abc_NormalizeArrivalTimes( pNormalArrTime, nVars, &nMaxArrival );

    *Cost = ABC_INFINITY;

    if ( Ses_StoreGetEntry( s_pSesStore, pTruth, nVars, pNormalArrTime, &pSol ) )
    {
        s_pSesStore->nCacheHits++;
        s_pSesStore->pCacheHits[nVars]++;
    }
    else
    {
        if ( s_pSesStore->fVeryVerbose )
        {
            printf( ANSI_COLOR_CYAN );
            Abc_TtPrintHexRev( stdout, pTruth, nVars );
            printf( ANSI_COLOR_RESET );
            printf( " [%d", pNormalArrTime[0] );
            for ( l = 1; l < nVars; ++l )
                printf( " %d", pNormalArrTime[l] );
            printf( "]@%d:", AigLevel );
            fflush( stdout );
        }

        nMaxDepth = pNormalArrTime[0];
        for ( i = 1; i < nVars; ++i )
            nMaxDepth = Abc_MaxInt( nMaxDepth, pNormalArrTime[i] );
        nMaxDepth += nVars + 1;
        if ( AigLevel != -1 )
            nMaxDepth = Abc_MinInt( AigLevel - nDelta, nMaxDepth + nVars + 1 );

        timeStartExact = Abc_Clock();

        pSes = Ses_ManAlloc( pTruth, nVars, 1 /* nSpecFunc */, nMaxDepth, pNormalArrTime, s_pSesStore->fMakeAIG, s_pSesStore->nBTLimit, s_pSesStore->fVerbose );
        pSes->fVeryVerbose = s_pSesStore->fVeryVerbose;
        pSes->pSat = s_pSesStore->pSat;
        pSes->nStartGates = nVars - 2;

        while ( pSes->nMaxDepth ) /* there is improvement */
        {
            if ( s_pSesStore->fVeryVerbose )
            {
                printf( " %d", pSes->nMaxDepth );
                fflush( stdout );
            }

            if ( ( pSol2 = Ses_ManFindMinimumSize( pSes ) ) != NULL )
            {
                if ( s_pSesStore->fVeryVerbose )
                {
                    if ( pSes->nMaxDepth >= 10 ) printf( "\b" );
                    printf( "\b" ANSI_COLOR_GREEN "%d" ANSI_COLOR_RESET, pSes->nMaxDepth );
                }
                if ( pSol )
                    ABC_FREE( pSol );
                pSol = pSol2;
                pSes->nMaxDepth--;
            }
            else
            {
                if ( s_pSesStore->fVeryVerbose )
                {
                    if ( pSes->nMaxDepth >= 10 ) printf( "\b" );
                    printf( "\b%s%d" ANSI_COLOR_RESET, pSes->fHitResLimit ? ANSI_COLOR_RED : ANSI_COLOR_YELLOW, pSes->nMaxDepth );
                }
                break;
            }
        }

        if ( s_pSesStore->fVeryVerbose )
            printf( "        \n" );

        /* log unsuccessful case for debugging */
        if ( s_pSesStore->pDebugEntries && pSes->fHitResLimit )
            Ses_StorePrintDebugEntry( s_pSesStore, pTruth, nVars, pNormalArrTime, pSes->nMaxDepth, pSol, nVars - 2 );

        pSes->timeTotal = Abc_Clock() - timeStartExact;

        /* statistics */
        s_pSesStore->nSatCalls += pSes->nSatCalls;
        s_pSesStore->nUnsatCalls += pSes->nUnsatCalls;
        s_pSesStore->nUndefCalls += pSes->nUndefCalls;

        s_pSesStore->timeSat += pSes->timeSat;
        s_pSesStore->timeSatSat += pSes->timeSatSat;
        s_pSesStore->timeSatUnsat += pSes->timeSatUnsat;
        s_pSesStore->timeSatUndef += pSes->timeSatUndef;
        s_pSesStore->timeInstance += pSes->timeInstance;
        s_pSesStore->timeExact += pSes->timeTotal;

        /* cleanup (we need to clean before adding since pTruth may have been modified by pSes) */
        fResLimit = pSes->fHitResLimit;
        Ses_ManCleanLight( pSes );

        /* store solution */
        Ses_StoreAddEntry( s_pSesStore, pTruth, nVars, pNormalArrTime, pSol, fResLimit );
    }

    if ( pSol )
    {
        *Cost = pSol[ABC_EXACT_SOL_NGATES];
        p = pSol + 3 + 4 * pSol[ABC_EXACT_SOL_NGATES] + 1;
        Delay = *p++;
        for ( l = 0; l < nVars; ++l )
            pPerm[l] = *p++;
    }

    if ( pSol )
    {
        int Delay2 = 0;
        for ( l = 0; l < nVars; ++l )
        {
            //printf( "%d ", pPerm[l] );
            Delay2 = Abc_MaxInt( Delay2, pArrTimeProfile[l] + pPerm[l] );
        }
        //printf( "  output arrival = %d    recomputed = %d\n", Delay, Delay2 );
        //if ( Delay != Delay2 )
        //{
        //    printf( "^--- BUG!\n" );
        //    assert( 0 );
        //}

        s_pSesStore->timeTotal += ( Abc_Clock() - timeStart );
        return Delay2;
    }
    else
    {
        assert( *Cost == ABC_INFINITY );

        s_pSesStore->timeTotal += ( Abc_Clock() - timeStart );
        return ABC_INFINITY;
    }
}